

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O1

void __thiscall
happly::TypedListProperty<float>::readNext(TypedListProperty<float> *this,istream *stream)

{
  iterator __position;
  long lVar1;
  size_t afterSize;
  size_t count;
  unsigned_long local_38;
  long local_30;
  
  local_30 = 0;
  std::istream::read((char *)stream,(long)&local_30);
  lVar1 = (long)(this->flattenedData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->flattenedData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_38 = (lVar1 >> 2) + local_30;
  geometrycentral::surface::std::vector<float,_std::allocator<float>_>::resize
            (&this->flattenedData,local_38);
  if (local_30 != 0) {
    std::istream::read((char *)stream,
                       lVar1 + (long)(this->flattenedData).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start);
  }
  __position._M_current =
       (this->flattenedIndexStart).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->flattenedIndexStart).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->flattenedIndexStart,
               __position,&local_38);
  }
  else {
    *__position._M_current = local_38;
    (this->flattenedIndexStart).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

virtual void readNext(std::istream& stream) override {

    // Read the size of the list
    size_t count = 0;
    stream.read(((char*)&count), listCountBytes);

    // Read list elements
    size_t currSize = flattenedData.size();
    size_t afterSize = currSize + count;
    flattenedData.resize(afterSize);
    if (count > 0) {
      stream.read((char*)&flattenedData[currSize], count * sizeof(T));
    }
    flattenedIndexStart.emplace_back(afterSize);
  }